

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSampleShadingTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_2::MinSampleShadingValueCase::iterate
          (MinSampleShadingValueCase *this)

{
  ostringstream *poVar1;
  TestLog *log;
  int iVar2;
  undefined4 extraout_var;
  float value;
  CallLogWrapper gl;
  ResultCollector result;
  Random rnd;
  CallLogWrapper local_220;
  ResultCollector local_208;
  deRandom local_1b8;
  undefined1 local_1a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [6];
  ios_base local_130 [264];
  
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&local_220,(Functions *)CONCAT44(extraout_var,iVar2),
             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log);
  log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_1a8._0_8_ = local_198;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8," // ERROR: ","");
  tcu::ResultCollector::ResultCollector(&local_208,log,(string *)local_1a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._0_8_ != local_198) {
    operator_delete((void *)local_1a8._0_8_,local_198[0]._M_allocated_capacity + 1);
  }
  local_220.m_enableLog = true;
  local_1a8._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1a8 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"Verifying initial value",0x17);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_130);
  deqp::gls::StateQueryUtil::verifyStateFloat(&local_208,&local_220,0x8c37,0.0,this->m_verifier);
  local_1a8._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1a8 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"Verifying special values",0x18);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_130);
  glu::CallLogWrapper::glMinSampleShading(&local_220,0.0);
  deqp::gls::StateQueryUtil::verifyStateFloat(&local_208,&local_220,0x8c37,0.0,this->m_verifier);
  glu::CallLogWrapper::glMinSampleShading(&local_220,1.0);
  deqp::gls::StateQueryUtil::verifyStateFloat(&local_208,&local_220,0x8c37,1.0,this->m_verifier);
  glu::CallLogWrapper::glMinSampleShading(&local_220,0.5);
  deqp::gls::StateQueryUtil::verifyStateFloat(&local_208,&local_220,0x8c37,0.5,this->m_verifier);
  deRandom_init(&local_1b8,0xde123);
  local_1a8._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1a8 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"Verifying random values",0x17);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_130);
  iVar2 = 10;
  do {
    value = deRandom_getFloat(&local_1b8);
    glu::CallLogWrapper::glMinSampleShading(&local_220,value);
    deqp::gls::StateQueryUtil::verifyStateFloat(&local_208,&local_220,0x8c37,value,this->m_verifier)
    ;
    iVar2 = iVar2 + -1;
  } while (iVar2 != 0);
  tcu::ResultCollector::setTestContextResult
            (&local_208,(this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208.m_message._M_dataplus._M_p != &local_208.m_message.field_2) {
    operator_delete(local_208.m_message._M_dataplus._M_p,
                    local_208.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208.m_prefix._M_dataplus._M_p != &local_208.m_prefix.field_2) {
    operator_delete(local_208.m_prefix._M_dataplus._M_p,
                    local_208.m_prefix.field_2._M_allocated_capacity + 1);
  }
  glu::CallLogWrapper::~CallLogWrapper(&local_220);
  return STOP;
}

Assistant:

MinSampleShadingValueCase::IterateResult MinSampleShadingValueCase::iterate (void)
{
	glu::CallLogWrapper		gl		(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	tcu::ResultCollector	result	(m_testCtx.getLog(), " // ERROR: ");

	gl.enableLogging(true);

	// initial
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Verifying initial value" << tcu::TestLog::EndMessage;
		verifyStateFloat(result, gl, GL_MIN_SAMPLE_SHADING_VALUE, 0.0, m_verifier);
	}

	// special values
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Verifying special values" << tcu::TestLog::EndMessage;

		gl.glMinSampleShading(0.0f);
		verifyStateFloat(result, gl, GL_MIN_SAMPLE_SHADING_VALUE, 0.0, m_verifier);

		gl.glMinSampleShading(1.0f);
		verifyStateFloat(result, gl, GL_MIN_SAMPLE_SHADING_VALUE, 1.0, m_verifier);

		gl.glMinSampleShading(0.5f);
		verifyStateFloat(result, gl, GL_MIN_SAMPLE_SHADING_VALUE, 0.5, m_verifier);
	}

	// random values
	{
		const int	numRandomTests	= 10;
		de::Random	rnd				(0xde123);

		m_testCtx.getLog() << tcu::TestLog::Message << "Verifying random values" << tcu::TestLog::EndMessage;

		for (int randNdx = 0; randNdx < numRandomTests; ++randNdx)
		{
			const float value = rnd.getFloat();

			gl.glMinSampleShading(value);
			verifyStateFloat(result, gl, GL_MIN_SAMPLE_SHADING_VALUE, value, m_verifier);
		}
	}

	result.setTestContextResult(m_testCtx);
	return STOP;
}